

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,void *value)

{
  char spec;
  iterator iVar1;
  error_handler local_21;
  void *local_20;
  void *value_local;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *this_local;
  
  spec = this->specs_->type_;
  local_20 = value;
  value_local = this;
  error_handler::error_handler(&local_21);
  check_pointer_type_spec<char,fmt::v5::internal::error_handler>(spec,&local_21);
  write_pointer(this,local_20);
  iVar1 = out(this);
  return (iterator)iVar1.container;
}

Assistant:

iterator operator()(const void *value) {
    check_pointer_type_spec(specs_.type_, internal::error_handler());
    write_pointer(value);
    return out();
  }